

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_tests.cpp
# Opt level: O2

void __thiscall i2p_tests::damaged_private_key::test_method(damaged_private_key *this)

{
  long lVar1;
  string message;
  string message_00;
  MatchFn match;
  MatchFn match_00;
  condition_variable cVar2;
  bool bVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  const_string file;
  const_string file_00;
  undefined4 uVar7;
  undefined4 uVar8;
  check_type cVar11;
  path *ppVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  char *in_stack_fffffffffffffaf8;
  char *in_stack_fffffffffffffb00;
  char *in_stack_fffffffffffffb08;
  _Invoker_type in_stack_fffffffffffffb10;
  assertion_result local_4e8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  bool proxy_error;
  _Any_data local_4a8;
  code *local_498;
  code *local_490;
  _Any_data local_488;
  code *local_478;
  code *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_438;
  CService local_420;
  Connection conn;
  string local_3a0 [32];
  DebugLogHelper debugloghelper28;
  string local_330 [32];
  DebugLogHelper debugloghelper27;
  Proxy sam_proxy;
  CService addr;
  CThreadInterrupt interrupt;
  undefined1 local_1e8 [16];
  undefined1 *local_1d8 [2];
  Session session;
  path local_88;
  path i2p_private_key_file;
  
  session.m_private_key_file.super_path._M_pathname.field_2._M_allocated_capacity =
       (size_type)CreateSock.super__Function_base._M_manager;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  session.m_private_key_file.super_path._M_pathname._M_dataplus._M_p._0_7_ =
       (undefined7)CreateSock.super__Function_base._M_functor._M_unused._M_member_pointer;
  session.m_private_key_file.super_path._M_pathname._M_dataplus._M_p._7_1_ =
       (undefined1)((ulong)CreateSock.super__Function_base._M_functor._0_8_ >> 0x38);
  session.m_private_key_file.super_path._M_pathname._M_string_length._0_1_ =
       (undefined1)CreateSock.super__Function_base._M_functor._8_8_;
  session.m_private_key_file.super_path._M_pathname._M_string_length._1_6_ =
       (undefined6)((ulong)CreateSock.super__Function_base._M_functor._8_8_ >> 8);
  session.m_private_key_file.super_path._M_pathname._M_string_length._7_1_ =
       (undefined1)((ulong)CreateSock.super__Function_base._M_functor._8_8_ >> 0x38);
  CreateSock.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  CreateSock.super__Function_base._M_functor._8_8_ = 0;
  CreateSock.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp:135:18)>
       ::_M_manager;
  session.m_private_key_file.super_path._M_pathname.field_2._8_8_ = CreateSock._M_invoker;
  CreateSock._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp:135:18)>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&session);
  ArgsManager::GetDataDirNet
            ((path *)&local_88,
             &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_BasicTestingSetup.m_args);
  fs::operator/(&i2p_private_key_file,(path *)&local_88,"test_i2p_private_key_damaged");
  std::filesystem::__cxx11::path::~path(&local_88);
  std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<char_const(&)[1],char_const(&)[39],void>
            ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> *)&session,
             (char (*) [1])0xc694e1,(char (*) [39])"The private key is too short (0 < 387)");
  std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<char_const(&)[5],char_const(&)[39],void>
            ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> *)
             &session.m_control_host.proxy.super_CNetAddr.m_net,(char (*) [5])"abcd",
             (char (*) [39])"The private key is too short (4 < 387)");
  interrupt._0_8_ = &interrupt.field_0x10;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&interrupt,0x182,
             '\0');
  std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<std::__cxx11::string,char_const(&)[41],void>
            ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> *)&session.m_mutex,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&interrupt,
             (char (*) [41])"The private key is too short (386 < 387)");
  debugloghelper27.m_message._M_dataplus._M_p = (pointer)&debugloghelper27.m_message.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&debugloghelper27.m_message,0x181,'\0');
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sam_proxy,
                 &debugloghelper27.m_message,'\0');
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&conn,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sam_proxy,
                 '\x01');
  std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<std::__cxx11::string,char_const(&)[101],void>
            ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> *)&session.m_control_sock,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&conn,
             (char (*) [101])
             "Certificate length (1) designates that the private key should be 388 bytes, but it is only 387 bytes"
            );
  local_1e8._0_8_ = local_1d8;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,0x181,
             '\0');
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_420,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,'\0'
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_420,
                 '\x05');
  std::operator+(&debugloghelper28.m_message,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr,"abcd");
  std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<std::__cxx11::string,char_const(&)[101],void>
            ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> *)
             session.m_session_id.field_2._M_local_buf,&debugloghelper28.m_message,
             (char (*) [101])
             "Certificate length (5) designates that the private key should be 392 bytes, but it is only 391 bytes"
            );
  __l._M_len = 5;
  __l._M_array = (iterator)&session;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_438,__l,(allocator_type *)&local_4e8);
  lVar4 = 0x100;
  do {
    std::
    _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)((long)&session.m_private_key_file.super_path._M_pathname._M_dataplus._M_p +
                      lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x40);
  std::__cxx11::string::~string((string *)&debugloghelper28);
  std::__cxx11::string::~string((string *)&addr);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::string::~string((string *)&conn);
  std::__cxx11::string::~string((string *)&sam_proxy);
  std::__cxx11::string::~string((string *)&debugloghelper27);
  std::__cxx11::string::~string((string *)&interrupt);
  ppVar9 = &i2p_private_key_file;
  pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_438.
            super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (__str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_438.
               super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __str != pbVar10; __str = __str + 2) {
    local_448 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp"
    ;
    local_440 = "";
    local_458 = &boost::unit_test::basic_cstring<char_const>::null;
    local_450 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x9c;
    file.m_begin = (iterator)&local_448;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_458,msg);
    cVar2 = (condition_variable)WriteBinaryFile(&i2p_private_key_file,__str + 1);
    interrupt.cond = cVar2;
    interrupt._8_8_ = 0;
    interrupt._16_8_ = 0;
    conn.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
    super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.super__Head_base<0UL,_Sock_*,_false>.
    _M_head_impl = (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
                   anon_var_dwarf_787ee0;
    conn.me.super_CNetAddr.m_addr._union.indirect_contents.indirect = "";
    session.m_private_key_file.super_path._M_pathname._M_string_length._0_1_ = 0;
    session.m_private_key_file.super_path._M_pathname._M_dataplus._M_p._0_7_ = 0x113a070;
    session.m_private_key_file.super_path._M_pathname._M_dataplus._M_p._7_1_ = 0;
    session.m_private_key_file.super_path._M_pathname.field_2._M_allocated_capacity =
         (size_type)boost::unit_test::lazy_ostream::inst;
    session.m_private_key_file.super_path._M_pathname.field_2._8_8_ = &conn;
    local_468 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp"
    ;
    local_460 = "";
    uVar7 = 0;
    uVar8 = 0;
    pvVar5 = (iterator)0x2;
    pvVar6 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&interrupt,(lazy_ostream *)&session,2,0,WARN,_cVar11,
               (size_t)&local_468,0x9c);
    boost::detail::shared_count::~shared_count((shared_count *)&interrupt.field_0x10);
    CThreadInterrupt::CThreadInterrupt(&interrupt);
    session.m_private_key_file.super_path._M_pathname._M_string_length._0_1_ = 0;
    session.m_private_key_file.super_path._M_pathname._M_string_length._1_6_ = 0;
    session.m_private_key_file.super_path._M_pathname._M_dataplus._M_p._0_7_ = 0;
    session.m_private_key_file.super_path._M_pathname._M_dataplus._M_p._7_1_ = 0;
    session.m_private_key_file.super_path._M_pathname._M_string_length._7_1_ = 1;
    CService::CService(&addr,(in6_addr *)&session,0x1de8);
    Proxy::Proxy(&sam_proxy,&addr,false);
    i2p::sam::Session::Session(&session,&i2p_private_key_file,&sam_proxy,&interrupt);
    std::__cxx11::string::string<std::allocator<char>>
              (local_330,"Creating persistent SAM session",(allocator<char> *)&conn);
    local_488._M_unused._M_object = (void *)0x0;
    local_488._8_8_ = 0;
    local_470 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_invoke;
    local_478 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_manager;
    message._M_dataplus._M_p._4_4_ = uVar8;
    message._M_dataplus._M_p._0_4_ = uVar7;
    message._M_string_length = (size_type)_cVar11;
    message.field_2._M_allocated_capacity = (size_type)ppVar9;
    message.field_2._8_8_ = pbVar10;
    match.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffb00;
    match.super__Function_base._M_functor._M_unused._M_object = in_stack_fffffffffffffaf8;
    match.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffb08;
    match._M_invoker = in_stack_fffffffffffffb10;
    DebugLogHelper::DebugLogHelper(&debugloghelper27,message,match);
    std::_Function_base::~_Function_base((_Function_base *)&local_488);
    std::__cxx11::string::~string(local_330);
    std::__cxx11::string::string(local_3a0,__str);
    local_4a8._M_unused._M_object = (void *)0x0;
    local_4a8._8_8_ = 0;
    local_490 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_invoke;
    local_498 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_manager;
    message_00._M_dataplus._M_p._4_4_ = uVar8;
    message_00._M_dataplus._M_p._0_4_ = uVar7;
    message_00._M_string_length = (size_type)_cVar11;
    message_00.field_2._M_allocated_capacity = (size_type)ppVar9;
    message_00.field_2._8_8_ = pbVar10;
    match_00.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffb00;
    match_00.super__Function_base._M_functor._M_unused._M_object = in_stack_fffffffffffffaf8;
    match_00.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffb08;
    match_00._M_invoker = in_stack_fffffffffffffb10;
    DebugLogHelper::DebugLogHelper(&debugloghelper28,message_00,match_00);
    std::_Function_base::~_Function_base((_Function_base *)&local_4a8);
    std::__cxx11::string::~string(local_3a0);
    i2p::Connection::Connection(&conn);
    local_4c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp"
    ;
    local_4b8 = "";
    local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = pvVar6;
    msg_00.m_begin = pvVar5;
    file_00.m_end = (iterator)0xa9;
    file_00.m_begin = (iterator)&local_4c0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_4d0,
               msg_00);
    CService::CService(&local_420);
    bVar3 = i2p::sam::Session::Connect(&session,&local_420,&conn,&proxy_error);
    local_4e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)!bVar3;
    local_4e8.m_message.px = (element_type *)0x0;
    local_4e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    in_stack_fffffffffffffb08 = "!session.Connect(CService{}, conn, proxy_error)";
    in_stack_fffffffffffffb10 = (_Invoker_type)0xb93c7b;
    local_1e8[8] = false;
    local_1e8._0_8_ = &PTR__lazy_ostream_0113a070;
    local_1d8[0] = boost::unit_test::lazy_ostream::inst;
    local_1d8[1] = &stack0xfffffffffffffb08;
    in_stack_fffffffffffffaf8 =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp"
    ;
    in_stack_fffffffffffffb00 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_4e8,(lazy_ostream *)local_1e8,1,0,WARN,_cVar11,
               (size_t)&stack0xfffffffffffffaf8,0xa9);
    boost::detail::shared_count::~shared_count(&local_4e8.m_message.pn);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_420);
    i2p::Connection::~Connection(&conn);
    DebugLogHelper::~DebugLogHelper(&debugloghelper28);
    DebugLogHelper::~DebugLogHelper(&debugloghelper27);
    i2p::sam::Session::~Session(&session);
    Proxy::~Proxy(&sam_proxy);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
    std::condition_variable::~condition_variable(&interrupt.cond);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_438);
  std::filesystem::__cxx11::path::~path(&i2p_private_key_file.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(damaged_private_key)
{
    CreateSock = [](int, int, int) {
        return std::make_unique<StaticContentsSock>("HELLO REPLY RESULT=OK VERSION=3.1\n"
                                                    "SESSION STATUS RESULT=OK DESTINATION=\n");
    };

    const auto i2p_private_key_file = m_args.GetDataDirNet() / "test_i2p_private_key_damaged";

    for (const auto& [file_contents, expected_error] : std::vector<std::tuple<std::string, std::string>>{
             {"", "The private key is too short (0 < 387)"},

             {"abcd", "The private key is too short (4 < 387)"},

             {std::string(386, '\0'), "The private key is too short (386 < 387)"},

             {std::string(385, '\0') + '\0' + '\1',
              "Certificate length (1) designates that the private key should be 388 bytes, but it is only "
              "387 bytes"},

             {std::string(385, '\0') + '\0' + '\5' + "abcd",
              "Certificate length (5) designates that the private key should be 392 bytes, but it is only "
              "391 bytes"}}) {
        BOOST_REQUIRE(WriteBinaryFile(i2p_private_key_file, file_contents));

        CThreadInterrupt interrupt;
        const CService addr{in6_addr(IN6ADDR_LOOPBACK_INIT), /*port=*/7656};
        const Proxy sam_proxy{addr, false};
        i2p::sam::Session session(i2p_private_key_file, sam_proxy, &interrupt);

        {
            ASSERT_DEBUG_LOG("Creating persistent SAM session");
            ASSERT_DEBUG_LOG(expected_error);

            i2p::Connection conn;
            bool proxy_error;
            BOOST_CHECK(!session.Connect(CService{}, conn, proxy_error));
        }
    }
}